

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall
summarycalc::outputsummaryset(summarycalc *this,int sample_size,int summary_set,int event_id)

{
  int iVar1;
  int iVar2;
  OASIS_FLOAT **ppOVar3;
  OASIS_FLOAT *pOVar4;
  int i;
  ulong uVar5;
  long lVar6;
  sampleslevelRec s;
  summarySampleslevelHeader sh;
  
  ppOVar3 = this->sssl[summary_set];
  pOVar4 = this->sse[summary_set];
  iVar1 = this->max_summary_id_[summary_set];
  for (uVar5 = (ulong)this->min_summary_id_[summary_set]; (long)uVar5 <= (long)iVar1;
      uVar5 = uVar5 + 1) {
    sh.summary_id = (int)uVar5;
    sh.expval = pOVar4[uVar5];
    if ((0.0 < sh.expval) || (this->zerooutput_ == true)) {
      sh.event_id = event_id;
      if ((FILE *)this->idxout[summary_set] != (FILE *)0x0) {
        fprintf((FILE *)this->idxout[summary_set],"%d,%lld\n",uVar5 & 0xffffffff,
                this->offset_[summary_set]);
      }
      fwrite(&sh,0xc,1,(FILE *)this->fout[summary_set]);
      this->offset_[summary_set] = this->offset_[summary_set] + 0xc;
      for (lVar6 = (long)this->first_idx_; iVar2 = this->num_idx_, lVar6 <= iVar2 + sample_size;
          lVar6 = lVar6 + 1) {
        s.sidx = (int)lVar6 - iVar2;
        if (((int)lVar6 != iVar2 + -4 && s.sidx != 0) && (1 < s.sidx + 3U)) {
          s.loss = ppOVar3[uVar5][lVar6];
          if ((this->zerooutput_ != false) || ((s.sidx == -1 || (0.0 < ppOVar3[uVar5][lVar6])))) {
            fwrite(&s,8,1,(FILE *)this->fout[summary_set]);
            this->offset_[summary_set] = this->offset_[summary_set] + 8;
          }
        }
      }
      s.sidx = 0;
      s.loss = 0.0;
      fwrite(&s,8,1,(FILE *)this->fout[summary_set]);
      this->offset_[summary_set] = this->offset_[summary_set] + 8;
    }
  }
  return;
}

Assistant:

void summarycalc::outputsummaryset(int sample_size, int summary_set, int event_id)
{
	OASIS_FLOAT **ssl = sssl[summary_set]; // OASIS_FLOAT **ssl two dimensional array of ssl[summary_id][sidx] to loss
	OASIS_FLOAT *se = sse[summary_set];
	int maxsummaryids = max_summary_id_[summary_set];
	int minsummaryids = min_summary_id_[summary_set];
	for (int i = minsummaryids ; i <= maxsummaryids; i++) {
		summarySampleslevelHeader sh;
		sh.event_id = event_id;
		sh.summary_id = i;
		sh.expval = se[i];
		if (sh.expval > 0 || zerooutput_ == true) {
			if (idxout[summary_set] != nullptr) {   // Fill index file
				fprintf(idxout[summary_set], "%d,%lld\n", i, offset_[summary_set]);
			}
			fwrite(&sh, sizeof(sh), 1, fout[summary_set]);
			offset_[summary_set] += sizeof(sh);
			for (int j = first_idx_; j < sample_size + num_idx_ + 1; j++) {
				if (j != num_idx_ && j != number_of_affected_risk_idx + num_idx_) {   // sidx = 0 AND sidx = number_of_affected_risk_idx
					sampleslevelRec s;
					s.sidx = j - num_idx_;
					if (s.sidx == tiv_idx || s.sidx == std_dev_idx) {
						// skip
					}
					else {
						s.loss = ssl[i][j];
						if (zerooutput_ == false) {
							if (s.loss > 0.0 || s.sidx == mean_idx) {
								fwrite(&s, sizeof(s), 1, fout[summary_set]);
								offset_[summary_set] += sizeof(s);
							}
						}
						else {
							fwrite(&s, sizeof(s), 1, fout[summary_set]);
							offset_[summary_set] += sizeof(s);
						}

					}
				}
			}
			sampleslevelRec s;
			s.sidx = 0;
			s.loss = 0.0;
			fwrite(&s, sizeof(s), 1, fout[summary_set]);
			offset_[summary_set] += sizeof(s);
		}
	}
}